

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

bool __thiscall wabt::anon_unknown_25::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  undefined1 uVar1;
  Enum EVar2;
  
  EVar2 = type.enum_;
  uVar1 = 1;
  if (3 < (uint)(EVar2 + I8U)) {
    if ((uint)(EVar2 + 0x11) < 2) {
      return (this->options_->features).reference_types_enabled_;
    }
    if (EVar2 == Reference) {
      return (this->options_->features).function_references_enabled_;
    }
    if (EVar2 != V128) {
      return false;
    }
    uVar1 = (this->options_->features).simd_enabled_;
  }
  return (bool)uVar1;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::FuncRef:
    case Type::ExternRef:
      return options_.features.reference_types_enabled();

    case Type::Reference:
      return options_.features.function_references_enabled();

    default:
      return false;
  }
}